

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

CHAR LocalRegionGrayValuePredictZ7(IplImage *pImage)

{
  INT32U IVar1;
  INT8U *pIVar2;
  CHAR CVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  UINT count_of_gray [256];
  UINT aUStack_418 [258];
  
  memset(aUStack_418,0,0x400);
  pIVar2 = pImage->imageData;
  IVar1 = pImage->widthStep;
  iVar4 = IVar1 * 7 + 1;
  iVar6 = 7;
  do {
    lVar9 = 0;
    do {
      aUStack_418[pIVar2[(uint)(iVar4 + (int)lVar9)]] =
           aUStack_418[pIVar2[(uint)(iVar4 + (int)lVar9)]] + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xd);
    iVar6 = iVar6 + 1;
    iVar4 = iVar4 + IVar1;
  } while (iVar6 != 0xe);
  uVar5 = get_best_threshold(aUStack_418);
  iVar4 = IVar1 * 10 + 1;
  iVar6 = 10;
  uVar7 = 0;
  do {
    lVar9 = 0;
    do {
      uVar7 = (uVar7 + 1) - (uint)(uVar5 < pIVar2[(uint)(iVar4 + (int)lVar9)]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    iVar6 = iVar6 + 1;
    iVar4 = iVar4 + IVar1;
  } while (iVar6 != 0xe);
  iVar4 = IVar1 * 10 + 10;
  iVar6 = 10;
  uVar8 = 0;
  do {
    lVar9 = 0;
    do {
      uVar8 = (uVar8 + 1) - (uint)(uVar5 < pIVar2[(uint)(iVar4 + (int)lVar9)]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    iVar6 = iVar6 + 1;
    iVar4 = iVar4 + IVar1;
  } while (iVar6 != 0xe);
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  CVar3 = '7';
  if (2 < uVar7) {
    CVar3 = 'Z';
  }
  return CVar3;
}

Assistant:

CHAR LocalRegionGrayValuePredictZ7(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value1 = 0, sum_value = 0;

    //    区域 [7:14,1:14]
    UINT count_of_gray[256] = {0};
    int best_threshold;

    for (row = 7; row < 14; row++) {
        for (col = 1; col < 14; col++) {
            // get the pixel,
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            count_of_gray[locate_value] += 1;

        }
    }
    //    寻找 最优 二值化 阈值
    best_threshold = get_best_threshold(count_of_gray);

    //    区域 [10:14,1:5] 和
    for (row = 10; row < 14; row++) {
        for (col = 1; col < 5; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
//            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value += locate_value;
        }

    }
//    区域 [10:14,10:14]
    for (row = 10; row < 14; row++) {
        for (col = 10; col < 14; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            //            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value1 += locate_value;
        }
    }

    if (sum_value1 < sum_value)
        sum_value = sum_value1;

    if (sum_value > 2)
        return 'Z';
    else
        return '7';
}